

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:308:65)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:308:65)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  object *this_00;
  value *this_01;
  gc_heap_ptr_untyped *this_02;
  long *plVar1;
  void *pvVar2;
  void *pvVar3;
  object_ptr v;
  object_ptr o;
  undefined1 local_58 [48];
  
  this_01 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((this_01 !=
       (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
       super__Vector_impl_data._M_finish) && (this_01->type_ == object)) {
    this_02 = &value::object_value(this_01)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::get(this_02);
    object::prototype((object *)local_58);
    plVar1 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
    (**(code **)(*plVar1 + 0x88))(local_58 + 0x10,plVar1,this_);
    this_00 = (object *)(local_58 + 0x20);
    while ((gc_heap *)local_58._0_8_ != (gc_heap *)0x0) {
      pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_58 + 0x10));
      pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_58);
      if (pvVar2 == pvVar3) {
        __return_storage_ptr__->type_ = boolean;
        (__return_storage_ptr__->field_1).b_ = true;
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_58 + 0x10));
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_58);
        return __return_storage_ptr__;
      }
      gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_58);
      object::prototype(this_00);
      gc_heap_ptr_untyped::operator=((gc_heap_ptr_untyped *)local_58,(gc_heap_ptr_untyped *)this_00)
      ;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this_00);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_58 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_58);
  }
  __return_storage_ptr__->type_ = boolean;
  (__return_storage_ptr__->field_1).b_ = false;
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }